

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

string * __thiscall
front::irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
          (string *__return_storage_ptr__,irGenerator *this,TyKind kind)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
  *this_00;
  IntTy *pIVar1;
  PtrTy *this_01;
  mapped_type *pmVar2;
  SharedTyPtr *this_02;
  SharedTyPtr ty;
  Variable local_c8;
  Variable variable;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  undefined1 auStack_80 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  string local_60;
  __shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  variable.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001daf78;
  variable.priority = 0;
  variable.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  variable.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_7_
       = 0;
  variable._23_4_ = 0;
  if (kind == Ptr) {
    this_01 = (PtrTy *)operator_new(0x18);
    pIVar1 = (IntTy *)operator_new(8);
    (pIVar1->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dad68;
    std::__shared_ptr<mir::types::IntTy,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mir::types::IntTy,void>
              ((__shared_ptr<mir::types::IntTy,(__gnu_cxx::_Lock_policy)2> *)&local_88,pIVar1);
    this_02 = (SharedTyPtr *)auStack_80;
    auStack_80._8_8_ = local_88;
    a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_80._0_8_;
    local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    auStack_80._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    mir::types::PtrTy::PtrTy(this_01,(SharedTyPtr *)(auStack_80 + 8));
    std::__shared_ptr<mir::types::PtrTy,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mir::types::PtrTy,void>
              ((__shared_ptr<mir::types::PtrTy,(__gnu_cxx::_Lock_policy)2> *)&local_c8,this_01);
    std::__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2> *)&ty,
               (__shared_ptr<mir::types::PtrTy,_(__gnu_cxx::_Lock_policy)2> *)&local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8.ty);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_70);
  }
  else {
    if (kind != Int) goto LAB_0016a8f2;
    pIVar1 = (IntTy *)operator_new(8);
    (pIVar1->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dad68;
    std::__shared_ptr<mir::types::IntTy,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mir::types::IntTy,void>
              ((__shared_ptr<mir::types::IntTy,(__gnu_cxx::_Lock_policy)2> *)&local_c8,pIVar1);
    std::__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2> *)&ty,
               (__shared_ptr<mir::types::IntTy,_(__gnu_cxx::_Lock_policy)2> *)&local_c8);
    this_02 = &local_c8.ty;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_02);
LAB_0016a8f2:
  this_00 = &this->_funcNameToFuncData;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](this_00,(this->_funcStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
  getTmpName_abi_cxx11_((string *)&local_c8,this,pmVar2->_nowTmpId);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>);
  mir::inst::Variable::Variable(&local_c8,(SharedTyPtr *)&local_40,false,true,false);
  mir::inst::Variable::operator=(&variable,&local_c8);
  mir::inst::Variable::~Variable(&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__cxx11::string::string((string *)&local_60,(string *)__return_storage_ptr__);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](this_00,(this->_funcStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
  insertLocalValue(this,&local_60,pmVar2->_nowTmpId,&variable);
  std::__cxx11::string::~string((string *)&local_60);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](this_00,(this->_funcStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
  pmVar2->_nowTmpId = pmVar2->_nowTmpId + 1;
  mir::inst::Variable::~Variable(&variable);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

string irGenerator::getNewTmpValueName(TyKind kind) {
  SharedTyPtr ty;
  string name;
  Variable variable;

  switch (kind) {
    case mir::types::TyKind::Int:
      ty = shared_ptr<IntTy>(new IntTy());
      break;
    case mir::types::TyKind::Ptr:
      ty = shared_ptr<PtrTy>(new PtrTy(shared_ptr<IntTy>(new IntTy())));
      break;
    default:
      break;
  }

  name = getTmpName(_funcNameToFuncData[_funcStack.back()]._nowTmpId);
  variable = Variable(ty, false, true);
  insertLocalValue(name, _funcNameToFuncData[_funcStack.back()]._nowTmpId,
                   variable);
  _funcNameToFuncData[_funcStack.back()]._nowTmpId++;
  ;
  return name;
}